

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void __thiscall message_header_write_read::test_method(message_header_write_read *this)

{
  message_id id;
  message_header write_header;
  message_size size;
  message_header read_header;
  buffer buffer;
  buffer_writer writer;
  buffer_reader reader;
  message_id local_105;
  message_header local_104;
  message_id local_fc [7];
  message_header local_f5;
  assertion_result local_f0;
  buffer local_d8;
  char *local_b8;
  char *local_b0;
  binary_expr<boost::test_tools::assertion::value_expr<message_id_&>,_const_message_id_&,_boost::test_tools::assertion::op::EQ<message_id,_message_id,_void>_>
  local_a8;
  buffer_writer local_98;
  buffer_reader local_88;
  const_string local_70;
  const_string local_60;
  lazy_ostream local_50;
  undefined1 *local_40;
  char **local_38;
  
  local_fc[0] = 0x55;
  local_fc[1] = ~FIRST;
  local_fc[2] = FIRST;
  local_fc[3] = FIRST;
  local_105 = PING;
  local_d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_104.size = 0xff55;
  local_104.id = PING;
  buffer_writer::buffer_writer(&local_98,&local_d8);
  ::operator<<(&local_98,&local_104);
  buffer_reader::buffer_reader(&local_88,&local_d8);
  ::operator>>(&local_88,&local_f5);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1b2d70,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x184984);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/Stazer[P]autonomouscabs/test/cpp/main.cpp"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x76;
  local_a8.m_lhs.m_value = &local_f5.id;
  local_a8.m_rhs = &local_105;
  boost::test_tools::assertion::
  binary_expr<boost::test_tools::assertion::value_expr<message_id_&>,_const_message_id_&,_boost::test_tools::assertion::op::EQ<message_id,_message_id,_void>_>
  ::evaluate(&local_f0,&local_a8,false);
  local_b8 = "read_header.id == id";
  local_b0 = "";
  local_50.m_empty = false;
  local_50._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001ae7e8;
  local_40 = boost::unit_test::lazy_ostream::inst;
  local_60.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/Stazer[P]autonomouscabs/test/cpp/main.cpp"
  ;
  local_60.m_end = "";
  local_38 = &local_b8;
  boost::test_tools::tt_detail::report_assertion
            (&local_f0,&local_50,&local_60,0x76,CHECK,CHECK_BUILT_ASSERTION,0);
  boost::detail::shared_count::~shared_count(&local_f0.m_message.pn);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1b2d70,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x184984);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/Stazer[P]autonomouscabs/test/cpp/main.cpp"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x77;
  local_a8.m_rhs = local_fc;
  local_a8.m_lhs.m_value = (message_id *)&local_f5;
  boost::test_tools::assertion::
  binary_expr<boost::test_tools::assertion::value_expr<unsigned_int_&>,_const_unsigned_int_&,_boost::test_tools::assertion::op::EQ<unsigned_int,_unsigned_int,_void>_>
  ::evaluate(&local_f0,
             (binary_expr<boost::test_tools::assertion::value_expr<unsigned_int_&>,_const_unsigned_int_&,_boost::test_tools::assertion::op::EQ<unsigned_int,_unsigned_int,_void>_>
              *)&local_a8,false);
  local_b8 = "read_header.size == size";
  local_b0 = "";
  local_50.m_empty = false;
  local_50._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001ae7e8;
  local_40 = boost::unit_test::lazy_ostream::inst;
  local_70.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/Stazer[P]autonomouscabs/test/cpp/main.cpp"
  ;
  local_70.m_end = "";
  local_38 = &local_b8;
  boost::test_tools::tt_detail::report_assertion
            (&local_f0,&local_50,&local_70,0x77,CHECK,CHECK_BUILT_ASSERTION,0);
  boost::detail::shared_count::~shared_count(&local_f0.m_message.pn);
  if (local_d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(message_header_write_read)
{
    const message_size size = 0xFF55;
    const message_id id = message_id::PING;
    buffer buffer;

    message_header write_header;
    write_header.size = size;
    write_header.id = id;

    buffer_writer writer(buffer);
    writer << write_header;

    buffer_reader reader(buffer);
    message_header read_header;
    reader >> read_header;

    BOOST_TEST(read_header.id == id);
    BOOST_TEST(read_header.size == size);
}